

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

bool __thiscall tcmalloc::TestingPortalImpl::HaveSystemRelease(TestingPortalImpl *this)

{
  int iVar1;
  anon_class_1_0_00000001 local_11;
  TestingPortalImpl *local_10;
  TestingPortalImpl *this_local;
  
  if (HaveSystemRelease()::have == '\0') {
    local_10 = this;
    iVar1 = __cxa_guard_acquire(&HaveSystemRelease()::have);
    if (iVar1 != 0) {
      HaveSystemRelease::have = HaveSystemRelease::anon_class_1_0_00000001::operator()(&local_11);
      __cxa_guard_release(&HaveSystemRelease()::have);
    }
  }
  return (bool)(HaveSystemRelease::have & 1);
}

Assistant:

bool HaveSystemRelease() override {
    static bool have = ([] () {
      size_t actual;
      auto ptr = TCMalloc_SystemAlloc(kPageSize, &actual, 0);
      return TCMalloc_SystemRelease(ptr, actual);
    })();
    return have;
  }